

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::
     UniversalPrint<std::tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct&>>
               (tuple<(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *value,
               ostream *os)

{
  simple_struct *obj_bytes;
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  obj_bytes = (value->
              super__Tuple_impl<0UL,_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>)
              .
              super__Head_base<0UL,_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&,_false>
              ._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>(os,"@",1);
  poVar1 = std::ostream::_M_insert<void_const*>(os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  PrintBytesInObjectTo((uchar *)obj_bytes,4,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

void UniversalPrint(const T& value, ::std::ostream* os) {
  // A workarond for the bug in VC++ 7.1 that prevents us from instantiating
  // UniversalPrinter with T directly.
  typedef T T1;
  UniversalPrinter<T1>::Print(value, os);
}